

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O3

void ymz280b_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  byte *pbVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  DEV_SMPL *pDVar5;
  DEV_SMPL *pDVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  code *pcVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  long lVar18;
  undefined8 uVar19;
  ushort uVar20;
  ulong uVar21;
  undefined8 uVar22;
  ushort uVar23;
  ushort uVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  ushort *puVar29;
  uint uVar30;
  ulong uVar31;
  ymz280b_state *chip;
  
  pDVar5 = *outputs;
  pDVar6 = outputs[1];
  uVar31 = (ulong)samples;
  memset(pDVar5,0,uVar31 * 4);
  memset(pDVar6,0,uVar31 * 4);
  if (*(long *)((long)param + 0x2d0) == 0) {
    return;
  }
  lVar18 = 0;
LAB_0015633d:
  lVar9 = lVar18 * 0x4c;
  if (*(char *)((long)param + lVar9 + 0x69) == '\0') {
    pbVar1 = (byte *)((long)param + lVar9 + 0x20);
    uVar24 = *(ushort *)((long)param + lVar9 + 0x66);
    sVar2 = *(short *)(pbVar1 + 0x44);
    bVar7 = *pbVar1;
    if ((uVar24 == 0 && bVar7 == 0) && sVar2 == 0) {
      pbVar1[0x40] = 0;
      pbVar1[0x41] = 0x40;
      pbVar1[0x42] = 0;
      pbVar1[0x43] = 0;
      goto LAB_00156ad0;
    }
    puVar29 = *(ushort **)((long)param + 0x2e0);
    iVar3 = *(int *)((long)param + lVar9 + 0x54);
    iVar4 = *(int *)((long)param + lVar9 + 0x58);
    iVar12 = *(int *)(pbVar1 + 0x40);
    if (samples != 0) {
      uVar16 = 0;
      do {
        if (0x3fff < iVar12) goto LAB_00156418;
        iVar12 = iVar12 * (short)uVar24 + (0x4000 - iVar12) * (int)sVar2 >> 0xe;
        pDVar5[uVar16] = pDVar5[uVar16] + iVar12 * iVar3;
        pDVar6[uVar16] = pDVar6[uVar16] + iVar12 * iVar4;
        iVar12 = *(int *)(pbVar1 + 0x40) + *(int *)(pbVar1 + 0x3c);
        *(int *)(pbVar1 + 0x40) = iVar12;
        uVar16 = uVar16 + 1;
      } while (uVar31 != uVar16);
    }
    uVar16 = (ulong)samples;
    if (iVar12 < 0x4000) goto LAB_00156ad0;
LAB_00156418:
    *(int *)(pbVar1 + 0x40) = iVar12 + -0x4000;
    uVar8 = (samples - (uint)uVar16) * *(int *)(pbVar1 + 0x3c) + iVar12 >> 0xe;
    uVar30 = 10000;
    if (uVar8 < 10000) {
      uVar30 = uVar8;
    }
    uVar13 = (uint)pbVar1[4] | (uint)bVar7 << 7;
    if (uVar13 == 0x83) {
      uVar13 = *(uint *)(pbVar1 + 0x1c);
      if (pbVar1[3] == 0) {
        uVar15 = 10000;
        if (uVar8 < 10000) {
          uVar15 = uVar8;
        }
        lVar9 = 0;
        do {
          if (uVar15 == (uint)lVar9) goto LAB_0015682e;
          uVar11 = uVar13 >> 1 & 0xffffff;
          if (uVar11 < *(uint *)((long)param + 0x2d8)) {
            uVar20 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar11) << 8;
          }
          else {
            uVar20 = 0;
          }
          uVar11 = (uVar13 >> 1) + 1 & 0xffffff;
          if (uVar11 < *(uint *)((long)param + 0x2d8)) {
            uVar23 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar11);
          }
          else {
            uVar23 = 0;
          }
          puVar29[lVar9] = uVar23 | uVar20;
          uVar13 = uVar13 + 4;
          lVar9 = lVar9 + 1;
        } while (uVar13 < *(uint *)(pbVar1 + 0x10));
      }
      else {
        uVar15 = 10000;
        if (uVar8 < 10000) {
          uVar15 = uVar8;
        }
        lVar9 = 0;
        do {
          if (uVar15 == (uint)lVar9) goto LAB_0015682e;
          uVar11 = uVar13 >> 1 & 0xffffff;
          if (uVar11 < *(uint *)((long)param + 0x2d8)) {
            uVar20 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar11) << 8;
          }
          else {
            uVar20 = 0;
          }
          uVar11 = (uVar13 >> 1) + 1 & 0xffffff;
          if (uVar11 < *(uint *)((long)param + 0x2d8)) {
            uVar23 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar11);
          }
          else {
            uVar23 = 0;
          }
          puVar29[lVar9] = uVar23 | uVar20;
          uVar13 = uVar13 + 4;
          if ((*(uint *)(pbVar1 + 0x18) <= uVar13) && (pbVar1[2] != 0)) {
            uVar13 = *(uint *)(pbVar1 + 0x14);
          }
          lVar9 = lVar9 + 1;
        } while (uVar13 < *(uint *)(pbVar1 + 0x10));
      }
      if (9999 < uVar8) {
        uVar8 = 10000;
      }
      uVar8 = uVar8 - (int)lVar9;
LAB_00156827:
      pbVar1[1] = 1;
      goto LAB_00156836;
    }
    if (uVar13 == 0x82) {
      uVar13 = *(uint *)(pbVar1 + 0x1c);
      if (pbVar1[3] == 0) {
        uVar15 = 10000;
        if (uVar8 < 10000) {
          uVar15 = uVar8;
        }
        lVar9 = 0;
        do {
          if (uVar15 == (uint)lVar9) goto LAB_00156786;
          uVar11 = uVar13 >> 1 & 0xffffff;
          if (uVar11 < *(uint *)((long)param + 0x2d8)) {
            uVar20 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar11) << 8;
          }
          else {
            uVar20 = 0;
          }
          puVar29[lVar9] = uVar20;
          uVar13 = uVar13 + 2;
          lVar9 = lVar9 + 1;
        } while (uVar13 < *(uint *)(pbVar1 + 0x10));
      }
      else {
        uVar15 = 10000;
        if (uVar8 < 10000) {
          uVar15 = uVar8;
        }
        lVar9 = 0;
        do {
          if (uVar15 == (uint)lVar9) goto LAB_00156786;
          uVar11 = uVar13 >> 1 & 0xffffff;
          if (uVar11 < *(uint *)((long)param + 0x2d8)) {
            uVar20 = (ushort)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar11) << 8;
          }
          else {
            uVar20 = 0;
          }
          puVar29[lVar9] = uVar20;
          uVar13 = uVar13 + 2;
          if ((*(uint *)(pbVar1 + 0x18) <= uVar13) && (pbVar1[2] != 0)) {
            uVar13 = *(uint *)(pbVar1 + 0x14);
          }
          lVar9 = lVar9 + 1;
        } while (uVar13 < *(uint *)(pbVar1 + 0x10));
      }
      if (9999 < uVar8) {
        uVar8 = 10000;
      }
      uVar8 = uVar8 - (int)lVar9;
      goto LAB_00156827;
    }
    if (uVar13 == 0x81) {
      uVar13 = *(uint *)(pbVar1 + 0x1c);
      uVar21 = (ulong)uVar13;
      iVar12 = *(int *)(pbVar1 + 0x20);
      iVar14 = *(int *)(pbVar1 + 0x24);
      if (pbVar1[3] == 0) {
        uVar15 = 10000;
        if (uVar8 < 10000) {
          uVar15 = uVar8;
        }
        iVar27 = uVar13 << 2;
        lVar9 = 0;
        do {
          if (uVar15 == (uint)lVar9) {
            uVar13 = (uint)lVar9 + uVar13;
            uVar8 = 0;
            goto LAB_00156986;
          }
          uVar11 = (uint)(uVar21 + lVar9 >> 1) & 0xffffff;
          uVar26 = 0;
          if (uVar11 < *(uint *)((long)param + 0x2d8)) {
            uVar26 = (uint)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar11);
          }
          uVar26 = uVar26 >> (~(byte)iVar27 & 4);
          iVar12 = iVar12 * 0xfe;
          iVar28 = iVar12 + 0xff;
          if (-1 < iVar12) {
            iVar28 = iVar12;
          }
          iVar25 = diff_lookup[uVar26 & 0xf] * iVar14;
          iVar12 = iVar25 + 7;
          if (-1 < iVar25) {
            iVar12 = iVar25;
          }
          iVar12 = (iVar12 >> 3) + (iVar28 >> 8);
          if (iVar12 < -0x7fff) {
            iVar12 = -0x8000;
          }
          if (0x7ffe < iVar12) {
            iVar12 = 0x7fff;
          }
          iVar14 = iVar14 * index_scale[uVar26 & 7] >> 8;
          if (iVar14 < 0x80) {
            iVar14 = 0x7f;
          }
          if (0x5fff < iVar14) {
            iVar14 = 0x6000;
          }
          puVar29[lVar9] = (ushort)iVar12;
          lVar9 = lVar9 + 1;
          iVar28 = (int)lVar9;
          iVar27 = iVar27 + 4;
        } while (iVar28 + uVar13 < *(uint *)(pbVar1 + 0x10));
        if (9999 < uVar8) {
          uVar8 = 10000;
        }
        uVar8 = uVar8 - iVar28;
        uVar13 = iVar28 + uVar13;
      }
      else {
        uVar15 = 10000;
        if (uVar8 < 10000) {
          uVar15 = uVar8;
        }
        lVar9 = 0;
        do {
          uVar13 = (uint)uVar21;
          if (uVar15 == (uint)lVar9) {
            uVar8 = 0;
            goto LAB_00156986;
          }
          uVar11 = (uint)(uVar21 >> 1) & 0xffffff;
          uVar26 = 0;
          if (uVar11 < *(uint *)((long)param + 0x2d8)) {
            uVar26 = (uint)*(byte *)(*(long *)((long)param + 0x2d0) + (ulong)uVar11);
          }
          uVar26 = uVar26 >> (~((char)uVar21 * '\x04') & 4U);
          iVar12 = iVar12 * 0xfe;
          iVar27 = iVar12 + 0xff;
          if (-1 < iVar12) {
            iVar27 = iVar12;
          }
          iVar28 = diff_lookup[uVar26 & 0xf] * iVar14;
          iVar12 = iVar28 + 7;
          if (-1 < iVar28) {
            iVar12 = iVar28;
          }
          iVar12 = (iVar12 >> 3) + (iVar27 >> 8);
          if (iVar12 < -0x7fff) {
            iVar12 = -0x8000;
          }
          if (0x7ffe < iVar12) {
            iVar12 = 0x7fff;
          }
          iVar14 = iVar14 * index_scale[uVar26 & 7] >> 8;
          if (iVar14 < 0x80) {
            iVar14 = 0x7f;
          }
          if (0x5fff < iVar14) {
            iVar14 = 0x6000;
          }
          puVar29[lVar9] = (ushort)iVar12;
          uVar13 = uVar13 + 1;
          uVar21 = (ulong)uVar13;
          if ((uVar13 == *(uint *)(pbVar1 + 0x14)) && (*(int *)(pbVar1 + 0x30) == 0)) {
            *(int *)(pbVar1 + 0x28) = iVar12;
            *(int *)(pbVar1 + 0x2c) = iVar14;
          }
          if ((*(uint *)(pbVar1 + 0x18) <= uVar13) && (pbVar1[2] != 0)) {
            iVar12 = *(int *)(pbVar1 + 0x28);
            iVar14 = *(int *)(pbVar1 + 0x2c);
            *(int *)(pbVar1 + 0x30) = *(int *)(pbVar1 + 0x30) + 1;
            uVar21 = (ulong)*(uint *)(pbVar1 + 0x14);
          }
          lVar9 = lVar9 + 1;
          uVar13 = (uint)uVar21;
        } while (uVar13 < *(uint *)(pbVar1 + 0x10));
        if (9999 < uVar8) {
          uVar8 = 10000;
        }
        uVar8 = uVar8 - (int)lVar9;
      }
      pbVar1[1] = 1;
LAB_00156986:
      *(uint *)(pbVar1 + 0x1c) = uVar13;
      *(int *)(pbVar1 + 0x20) = iVar12;
      *(int *)(pbVar1 + 0x24) = iVar14;
      goto LAB_00156992;
    }
    memset(puVar29,0,(ulong)(uVar30 * 2));
    goto LAB_00156996;
  }
  goto LAB_00156ad0;
LAB_0015682e:
  uVar8 = 0;
  goto LAB_00156836;
LAB_00156786:
  uVar8 = 0;
LAB_00156836:
  *(uint *)(pbVar1 + 0x1c) = uVar13;
LAB_00156992:
  if (uVar8 == 0) {
LAB_00156996:
    uVar8 = 0;
    if (pbVar1[1] == 0) goto LAB_00156a0a;
  }
  pbVar1[1] = 0;
  uVar13 = uVar30 - uVar8;
  uVar20 = uVar24;
  if (uVar13 != 0) {
    uVar20 = *(ushort *)(*(long *)((long)param + 0x2e0) + (ulong)(uVar13 - 1) * 2);
  }
  uVar15 = (uint)uVar20;
  if (uVar8 != 0) {
    lVar9 = *(long *)((long)param + 0x2e0);
    uVar21 = (ulong)uVar8;
    do {
      uVar11 = (short)uVar15 * 0xf;
      uVar15 = (short)uVar15 * 0xf + 0xf;
      if (-1 < (int)uVar11) {
        uVar15 = uVar11;
      }
      uVar15 = uVar15 >> 4;
      *(short *)(lVar9 + (ulong)uVar13 * 2) = (short)uVar15;
      uVar13 = uVar13 + 1;
      uVar21 = uVar21 - 1;
    } while (uVar21 != 0);
  }
  if (uVar30 != uVar8) {
    *pbVar1 = 0;
    pbVar1[0x48] = 1;
  }
LAB_00156a0a:
  uVar20 = *puVar29;
  if ((uint)uVar16 < samples) {
    puVar29 = puVar29 + 1;
    iVar12 = *(int *)(pbVar1 + 0x40);
    do {
      uVar21 = uVar16 & 0xffffffff;
      lVar9 = 0;
      do {
        if (0x3fff < iVar12) {
          uVar16 = (ulong)(uint)((int)uVar16 + (int)lVar9);
          goto LAB_00156a9d;
        }
        iVar12 = iVar12 * (short)uVar20 + (0x4000 - iVar12) * (int)(short)uVar24 >> 0xe;
        pDVar5[uVar21 + lVar9] = pDVar5[uVar21 + lVar9] + iVar12 * iVar3;
        pDVar6[uVar21 + lVar9] = pDVar6[uVar21 + lVar9] + iVar12 * iVar4;
        iVar12 = *(int *)(pbVar1 + 0x40) + *(int *)(pbVar1 + 0x3c);
        *(int *)(pbVar1 + 0x40) = iVar12;
        lVar9 = lVar9 + 1;
      } while ((uint)((int)lVar9 + (int)uVar16) < samples);
      uVar16 = uVar21 + lVar9;
      uVar23 = uVar20;
      if (0x3fff < iVar12) {
LAB_00156a9d:
        iVar12 = iVar12 + -0x4000;
        *(int *)(pbVar1 + 0x40) = iVar12;
        uVar23 = *puVar29;
        puVar29 = puVar29 + 1;
        uVar24 = uVar20;
      }
      uVar20 = uVar23;
    } while ((uint)uVar16 < samples);
  }
  *(ushort *)(pbVar1 + 0x44) = uVar24;
  *(ushort *)(pbVar1 + 0x46) = uVar20;
LAB_00156ad0:
  lVar18 = lVar18 + 1;
  if (lVar18 == 8) goto code_r0x00156ae2;
  goto LAB_0015633d;
code_r0x00156ae2:
  if (samples != 0) {
    pDVar5 = *outputs;
    pDVar6 = outputs[1];
    uVar16 = 0;
    do {
      pDVar5[uVar16] = pDVar5[uVar16] >> 8;
      pDVar6[uVar16] = pDVar6[uVar16] >> 8;
      uVar16 = uVar16 + 1;
    } while (uVar31 != uVar16);
  }
  pcVar17 = (char *)((long)param + 0x68);
  lVar18 = 0;
  do {
    if (*pcVar17 != '\0') {
      pcVar17[-0x48] = '\0';
      bVar7 = (byte)(1 << ((byte)lVar18 & 0x1f)) | *(byte *)((long)param + 0x281);
      *(byte *)((long)param + 0x281) = bVar7;
      if ((*(char *)((long)param + 0x284) == '\0') ||
         ((bVar7 & *(byte *)((long)param + 0x283)) == 0)) {
        if (*(char *)((long)param + 0x282) != '\0') {
          *(undefined1 *)((long)param + 0x282) = 0;
          pcVar10 = *(code **)((long)param + 0x298);
          if (pcVar10 != (code *)0x0) {
            uVar22 = *(undefined8 *)((long)param + 0x2a0);
            uVar19 = 0;
            goto LAB_00156b94;
          }
        }
      }
      else if (*(char *)((long)param + 0x282) == '\0') {
        *(undefined1 *)((long)param + 0x282) = 1;
        pcVar10 = *(code **)((long)param + 0x298);
        if (pcVar10 != (code *)0x0) {
          uVar22 = *(undefined8 *)((long)param + 0x2a0);
          uVar19 = 1;
LAB_00156b94:
          (*pcVar10)(uVar22,uVar19);
        }
      }
      *pcVar17 = '\0';
    }
    lVar18 = lVar18 + 1;
    pcVar17 = pcVar17 + 0x4c;
    if (lVar18 == 8) {
      return;
    }
  } while( true );
}

Assistant:

static void ymz280b_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	ymz280b_state *chip = (ymz280b_state *)param;
	DEV_SMPL *lacc = outputs[0];
	DEV_SMPL *racc = outputs[1];
	UINT8 v;
	UINT32 i;

	/* clear out the accumulator */
	memset(lacc, 0, samples * sizeof(lacc[0]));
	memset(racc, 0, samples * sizeof(racc[0]));
	if (chip->mem_base == NULL)
		return;

	/* loop over voices */
	for (v = 0; v < 8; v++)
	{
		struct YMZ280BVoice *voice = &chip->voice[v];
		INT16 prev = voice->last_sample;
		INT16 curr = voice->curr_sample;
		INT16 *curr_data = chip->scratch;
		INT32 *ldest = lacc;
		INT32 *rdest = racc;
		UINT32 new_samples, samples_left;
		UINT32 final_pos;
		INT32 lvol = voice->output_left;
		INT32 rvol = voice->output_right;
		
		/* skip if muted */
		if (voice->Muted)
			continue;

		/* quick out if we're not playing and we're at 0 */
		if (!voice->playing && curr == 0 && prev == 0)
		{
			/* make sure next sound plays immediately */
			voice->output_pos = FRAC_ONE;

			continue;
		}

		/* finish off the current sample */
		/* interpolate */
		for (i = 0; i < samples && voice->output_pos < FRAC_ONE; i++)
		{
			int interp_sample = (((INT32)prev * (FRAC_ONE - voice->output_pos)) + ((INT32)curr * voice->output_pos)) >> FRAC_BITS;
			ldest[i] += interp_sample * lvol;
			rdest[i] += interp_sample * rvol;
			voice->output_pos += voice->output_step;
		}

		/* if we're over, continue; otherwise, we're done */
		if (voice->output_pos >= FRAC_ONE)
			voice->output_pos -= FRAC_ONE;
		else
			continue;

		/* compute how many new samples we need */
		final_pos = voice->output_pos + (samples - i) * voice->output_step;
		new_samples = (final_pos + FRAC_ONE) >> FRAC_BITS;
		if (new_samples > MAX_SAMPLE_CHUNK)
			new_samples = MAX_SAMPLE_CHUNK;

		/* generate them into our buffer */
		switch (voice->playing << 7 | voice->mode)
		{
			case 0x81:  samples_left = generate_adpcm(chip, voice, chip->scratch, new_samples); break;
			case 0x82:  samples_left = generate_pcm8(chip, voice, chip->scratch, new_samples); break;
			case 0x83:  samples_left = generate_pcm16(chip, voice, chip->scratch, new_samples); break;
			default:    samples_left = 0; memset(chip->scratch, 0, new_samples * sizeof(chip->scratch[0])); break;
		}

		if (samples_left || voice->ended)
		{
			UINT32 base;
			UINT32 j;
			INT16 t;
			
			voice->ended = 0;
			base = new_samples - samples_left;
			t = (base == 0) ? curr : chip->scratch[base - 1];
			
			for (j = 0; j < samples_left; j++)
			{
				t = (t * 15) / 16;
				chip->scratch[base + j] = t;
			}

			/* if we hit the end and IRQs are enabled, signal it */
			if (base != 0)
			{
				voice->playing = 0;

				/* set update_irq_state_timer. IRQ is signaled on next CPU execution. */
				voice->irq_schedule = 1;
			}
		}

		/* advance forward one sample */
		prev = curr;
		curr = *curr_data++;

		/* then sample-rate convert with linear interpolation */
		while (i < samples)
		{
			/* interpolate */
			for (; i < samples && voice->output_pos < FRAC_ONE; i++)
			{
				int interp_sample = (((INT32)prev * (FRAC_ONE - voice->output_pos)) + ((INT32)curr * voice->output_pos)) >> FRAC_BITS;
				ldest[i] += interp_sample * lvol;
				rdest[i] += interp_sample * rvol;
				voice->output_pos += voice->output_step;
			}

			/* if we're over, grab the next samples */
			if (voice->output_pos >= FRAC_ONE)
			{
				voice->output_pos -= FRAC_ONE;
				prev = curr;
				curr = *curr_data++;
			}
		}

		/* remember the last samples */
		voice->last_sample = prev;
		voice->curr_sample = curr;
	}

	for (i = 0; i < samples; i++)
	{
		outputs[0][i] >>= 8;
		outputs[1][i] >>= 8;
	}
	
	for (v = 0; v < 8; v++)
		update_irq_state_timer_common(chip, v);
}